

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_ext_msg(raft_server *this,req_msg *req)

{
  bool bVar1;
  msg_type mVar2;
  int iVar3;
  element_type *peVar4;
  undefined8 uVar5;
  msg_base *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  req_msg *in_RSI;
  raft_server *in_RDI;
  ptr<resp_msg> pVar7;
  msg_type in_stack_000000dc;
  req_msg *in_stack_000000e0;
  raft_server *in_stack_000000e8;
  req_msg *in_stack_00000118;
  raft_server *in_stack_00000120;
  req_msg *in_stack_000001b8;
  raft_server *in_stack_000001c0;
  req_msg *in_stack_000001f0;
  raft_server *in_stack_000001f8;
  req_msg *in_stack_00000298;
  raft_server *in_stack_000002a0;
  string *psVar8;
  string local_58 [32];
  string local_38 [32];
  msg_base *local_18;
  req_msg *req_00;
  raft_server *this_00;
  
  local_18 = in_RDX;
  req_00 = in_RSI;
  this_00 = in_RDI;
  mVar2 = msg_base::get_type(in_RDX);
  switch(mVar2) {
  case add_server_request:
    pVar7 = handle_add_srv_req(in_stack_000001f8,in_stack_000001f0);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  default:
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &in_RSI[9].log_entries_.
                        super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14d869);
      iVar3 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (1 < iVar3) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x14d88c);
        msg_base::get_type(local_18);
        psVar8 = local_58;
        msg_type_to_string_abi_cxx11_(in_stack_000000dc);
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_((char *)local_38,"received request: %s, ignore it",uVar5);
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"handle_ext_msg",0x57e,local_38,peVar4,psVar8);
        std::__cxx11::string::~string(local_38);
        std::__cxx11::string::~string(local_58);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr((shared_ptr<nuraft::resp_msg> *)0x14d953);
    _Var6._M_pi = extraout_RDX;
    break;
  case remove_server_request:
    pVar7 = handle_rm_srv_req(in_stack_000002a0,in_stack_00000298);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case sync_log_request:
    pVar7 = handle_log_sync_req(in_stack_000000e8,in_stack_000000e0);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case join_cluster_request:
    pVar7 = handle_join_cluster_req(in_stack_00000120,in_stack_00000118);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case leave_cluster_request:
    pVar7 = handle_leave_cluster_req(this_00,req_00);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case install_snapshot_request:
    pVar7 = handle_install_snapshot_req(in_stack_000001c0,in_stack_000001b8);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case reconnect_request:
    pVar7 = handle_reconnect_req(this,req);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    break;
  case custom_notification_request:
    pVar7 = handle_custom_notification_req(in_stack_000000e8,in_stack_000000e0);
    _Var6 = pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_ext_msg(req_msg& req) {
    switch (req.get_type()) {
    case msg_type::add_server_request:
        return handle_add_srv_req(req);

    case msg_type::remove_server_request:
        return handle_rm_srv_req(req);

    case msg_type::sync_log_request:
        return handle_log_sync_req(req);

    case msg_type::join_cluster_request:
        return handle_join_cluster_req(req);

    case msg_type::leave_cluster_request:
        return handle_leave_cluster_req(req);

    case msg_type::install_snapshot_request:
        return handle_install_snapshot_req(req);

    case msg_type::reconnect_request:
        return handle_reconnect_req(req);

    case msg_type::custom_notification_request:
        return handle_custom_notification_req(req);

    default:
        p_er( "received request: %s, ignore it",
              msg_type_to_string(req.get_type()).c_str() );
        break;
    }

    return ptr<resp_msg>();
}